

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.h
# Opt level: O0

void __thiscall
slang::ast::AssignmentExpression::visitExprs<netlist::VariableReferenceVisitor&>
          (AssignmentExpression *this,VariableReferenceVisitor *visitor)

{
  Expression *in_RSI;
  AssignmentExpression *in_RDI;
  TimingControl *unaff_retaddr;
  
  if (in_RDI->timingControl != (TimingControl *)0x0) {
    TimingControl::visit<netlist::VariableReferenceVisitor>
              (unaff_retaddr,(VariableReferenceVisitor *)in_RDI);
  }
  left(in_RDI);
  Expression::visit<netlist::VariableReferenceVisitor&>(in_RSI,(VariableReferenceVisitor *)in_RDI);
  right(in_RDI);
  Expression::visit<netlist::VariableReferenceVisitor&>(in_RSI,(VariableReferenceVisitor *)in_RDI);
  return;
}

Assistant:

void visitExprs(TVisitor&& visitor) const {
        if (timingControl)
            timingControl->visit(visitor);
        left().visit(visitor);
        right().visit(visitor);
    }